

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warn.cc
# Opt level: O0

void __thiscall
re2c::Warn::unreachable_rule(Warn *this,string *cond,rule_info_t *rule,rules_t *rules)

{
  FILE *pFVar1;
  const_iterator cVar2;
  map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  *pmVar3;
  bool bVar4;
  undefined8 uVar5;
  size_type sVar6;
  reference prVar7;
  pointer ppVar8;
  _Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_> local_80;
  _Self local_78;
  _Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_> local_70;
  _Rb_tree_const_iterator<re2c::rule_rank_t> local_68;
  const_iterator i;
  char *pl;
  size_t shadows;
  byte local_29;
  rules_t *prStack_28;
  bool e;
  rules_t *rules_local;
  rule_info_t *rule_local;
  string *cond_local;
  Warn *this_local;
  
  if ((this->mask[5] & 1) != 0) {
    local_29 = (this->mask[5] & 2) != 0;
    this->error_accuml = (this->error_accuml & 1U) != 0 || (bool)local_29;
    prStack_28 = rules;
    rules_local = (rules_t *)rule;
    rule_local = (rule_info_t *)cond;
    cond_local = (string *)this;
    warning_start(rule->line,(bool)local_29);
    pFVar1 = _stderr;
    incond((string *)&shadows,(string *)rule_local);
    uVar5 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"unreachable rule %s",uVar5);
    std::__cxx11::string::~string((string *)&shadows);
    sVar6 = std::
            set<re2c::rule_rank_t,_std::less<re2c::rule_rank_t>,_std::allocator<re2c::rule_rank_t>_>
            ::size((set<re2c::rule_rank_t,_std::less<re2c::rule_rank_t>,_std::allocator<re2c::rule_rank_t>_>
                    *)&(rules_local->_M_t)._M_impl.super__Rb_tree_header);
    if (sVar6 != 0) {
      i._M_node = (_Base_ptr)0x1e2c50;
      if (1 < sVar6) {
        i._M_node = (_Base_ptr)0x1e243a;
      }
      local_68._M_node =
           (_Base_ptr)
           std::
           set<re2c::rule_rank_t,_std::less<re2c::rule_rank_t>,_std::allocator<re2c::rule_rank_t>_>
           ::begin((set<re2c::rule_rank_t,_std::less<re2c::rule_rank_t>,_std::allocator<re2c::rule_rank_t>_>
                    *)&(rules_local->_M_t)._M_impl.super__Rb_tree_header);
      pmVar3 = prStack_28;
      cVar2._M_node = i._M_node;
      pFVar1 = _stderr;
      prVar7 = std::_Rb_tree_const_iterator<re2c::rule_rank_t>::operator*(&local_68);
      local_70._M_node =
           (_Base_ptr)
           std::
           map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
           ::find(pmVar3,prVar7);
      ppVar8 = std::_Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>
               ::operator->(&local_70);
      fprintf(pFVar1,"(shadowed by rule%s at line%s %u",cVar2._M_node,cVar2._M_node,
              (ulong)(ppVar8->second).line);
      std::_Rb_tree_const_iterator<re2c::rule_rank_t>::operator++(&local_68);
      while( true ) {
        local_78._M_node =
             (_Base_ptr)
             std::
             set<re2c::rule_rank_t,_std::less<re2c::rule_rank_t>,_std::allocator<re2c::rule_rank_t>_>
             ::end((set<re2c::rule_rank_t,_std::less<re2c::rule_rank_t>,_std::allocator<re2c::rule_rank_t>_>
                    *)&(rules_local->_M_t)._M_impl.super__Rb_tree_header);
        bVar4 = std::operator!=(&local_68,&local_78);
        pmVar3 = prStack_28;
        pFVar1 = _stderr;
        if (!bVar4) break;
        prVar7 = std::_Rb_tree_const_iterator<re2c::rule_rank_t>::operator*(&local_68);
        local_80._M_node =
             (_Base_ptr)
             std::
             map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
             ::find(pmVar3,prVar7);
        ppVar8 = std::
                 _Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>::
                 operator->(&local_80);
        fprintf(pFVar1,", %u",(ulong)(ppVar8->second).line);
        std::_Rb_tree_const_iterator<re2c::rule_rank_t>::operator++(&local_68);
      }
      fprintf(_stderr,")");
    }
    warning_end(PTR_anon_var_dwarf_3b360_002113a8,(bool)(local_29 & 1));
  }
  return;
}

Assistant:

void Warn::unreachable_rule (const std::string & cond, const rule_info_t & rule, const rules_t & rules)
{
	if (mask[UNREACHABLE_RULES] & WARNING)
	{
		const bool e = mask[UNREACHABLE_RULES] & ERROR;
		error_accuml |= e;
		warning_start (rule.line, e);
		fprintf (stderr, "unreachable rule %s", incond (cond).c_str ());
		const size_t shadows = rule.shadow.size ();
		if (shadows > 0)
		{
			const char * pl = shadows > 1
				? "s"
				: "";
			std::set<rule_rank_t>::const_iterator i = rule.shadow.begin ();
			fprintf (stderr, "(shadowed by rule%s at line%s %u", pl, pl, rules.find (*i)->second.line);
			for (++i; i != rule.shadow.end (); ++i)
			{
				fprintf (stderr, ", %u", rules.find (*i)->second.line);
			}
			fprintf (stderr, ")");
		}
		warning_end (names[UNREACHABLE_RULES], e);
	}
}